

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

VkPipeline_T ** __thiscall
Fossilize::StateRecorder::Impl::copy<VkPipeline_T*>
          (Impl *this,VkPipeline_T **src,size_t count,ScratchAllocator *alloc)

{
  VkPipeline_T **new_data;
  ScratchAllocator *alloc_local;
  size_t count_local;
  VkPipeline_T **src_local;
  Impl *this_local;
  
  if (count == 0) {
    this_local = (Impl *)0x0;
  }
  else {
    this_local = (Impl *)ScratchAllocator::allocate_n<VkPipeline_T*>(alloc,count);
    if (this_local != (Impl *)0x0) {
      std::copy<VkPipeline_T*const*,VkPipeline_T**>(src,src + count,(VkPipeline_T **)this_local);
    }
  }
  return (VkPipeline_T **)this_local;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}